

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_add.cxx
# Opt level: O0

int __thiscall
Fl_Menu_::insert(Fl_Menu_ *this,int index,char *label,int shortcut,Fl_Callback *callback,
                void *userdata,int flags)

{
  undefined1 auVar1 [16];
  Fl_Menu_ *pFVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  Fl_Menu_Item *pFVar6;
  int value_offset;
  int r;
  Fl_Menu_Item *newMenu;
  int n;
  int value_offset_1;
  Fl_Menu_ *o;
  void *userdata_local;
  Fl_Callback *callback_local;
  int shortcut_local;
  char *label_local;
  int index_local;
  Fl_Menu_ *this_local;
  
  iVar3 = local_array_size;
  pFVar2 = fl_menu_array_owner;
  if (this != fl_menu_array_owner) {
    if (fl_menu_array_owner != (Fl_Menu_ *)0x0) {
      lVar4 = (long)fl_menu_array_owner->value_ - (long)local_array;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)local_array_size;
      uVar5 = SUB168(auVar1 * ZEXT816(0x38),0);
      if (SUB168(auVar1 * ZEXT816(0x38),8) != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      pFVar6 = (Fl_Menu_Item *)operator_new__(uVar5);
      pFVar2->menu_ = pFVar6;
      memcpy(pFVar6,local_array,(long)iVar3 * 0x38);
      if (pFVar2->value_ != (Fl_Menu_Item *)0x0) {
        pFVar2->value_ = pFVar6 + (int)(lVar4 / 0x38);
      }
    }
    if (this->menu_ == (Fl_Menu_Item *)0x0) {
      this->alloc = '\x02';
      if (local_array == (Fl_Menu_Item *)0x0) {
        local_array_alloc = 0xf;
        uVar5 = SUB168(ZEXT816(0xf) * ZEXT816(0x38),0);
        if (SUB168(ZEXT816(0xf) * ZEXT816(0x38),8) != 0) {
          uVar5 = 0xffffffffffffffff;
        }
        local_array = (Fl_Menu_Item *)operator_new__(uVar5);
        this->menu_ = local_array;
        memset(local_array,0,(long)local_array_alloc * 0x38);
      }
      else {
        this->menu_ = local_array;
      }
      memset(this->menu_,0,0x38);
      local_array_size = 1;
      fl_menu_array_owner = this;
    }
    else {
      if (local_array != (Fl_Menu_Item *)0x0) {
        operator_delete__(local_array);
      }
      if (this->alloc == '\0') {
        copy(this,(EVP_PKEY_CTX *)this->menu_,(EVP_PKEY_CTX *)0x0);
      }
      local_array_size = size(this);
      local_array = this->menu_;
      fl_menu_array_owner = this;
      local_array_alloc = local_array_size;
    }
  }
  iVar3 = Fl_Menu_Item::insert(this->menu_,index,label,shortcut,callback,userdata,flags);
  pFVar6 = this->menu_;
  this->menu_ = local_array;
  if (this->value_ != (Fl_Menu_Item *)0x0) {
    this->value_ = this->menu_ + (int)(((long)this->value_ - (long)pFVar6) / 0x38);
  }
  return iVar3;
}

Assistant:

int Fl_Menu_::insert(
  int index,
  const char *label,
  int shortcut,
  Fl_Callback *callback,
  void *userdata,
  int flags
) {
  // make this widget own the local array:
  if (this != fl_menu_array_owner) {
    if (fl_menu_array_owner) {
      Fl_Menu_* o = fl_menu_array_owner;
      // the previous owner gets its own correctly-sized array:
      int value_offset = (int) (o->value_-local_array);
      int n = local_array_size;
      Fl_Menu_Item* newMenu = o->menu_ = new Fl_Menu_Item[n];
      memcpy(newMenu, local_array, n*sizeof(Fl_Menu_Item));
      if (o->value_) o->value_ = newMenu+value_offset;
    }
    if (menu_) {
      // this already has a menu array, use it as the local one:
      delete[] local_array;
      if (!alloc) copy(menu_); // duplicate a user-provided static array
      // add to the menu's current array:
      local_array_alloc = local_array_size = size();
      local_array = menu_;
    } else {
      // start with a blank array:
      alloc = 2; // indicates that the strings can be freed
      if (local_array) {
	menu_ = local_array;
      } else {
	local_array_alloc = 15;
	local_array = menu_ = new Fl_Menu_Item[local_array_alloc];
        memset(local_array, 0, sizeof(Fl_Menu_Item) * local_array_alloc);
      }
      memset(menu_, 0, sizeof(Fl_Menu_Item));
      local_array_size = 1;
    }
    fl_menu_array_owner = this;
  }
  int r = menu_->insert(index,label,shortcut,callback,userdata,flags);
  // if it rellocated array we must fix the pointer:
  int value_offset = (int) (value_-menu_);
  menu_ = local_array; // in case it reallocated it
  if (value_) value_ = menu_+value_offset;
  return r;
}